

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
cnn::PickElement::forward_impl
          (PickElement *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer ppTVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar5;
  pointer puVar6;
  pointer puVar7;
  Tensor *pTVar8;
  float *pfVar9;
  float *pfVar10;
  ulong uVar11;
  ostream *poVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  int iVar16;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_48;
  
  if (this->pval == (uint *)0x0) {
    pvVar5 = this->pvals;
    if (pvVar5 == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                    ,0x615,
                    "virtual void cnn::PickElement::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    puVar6 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (pvVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar14 = (long)puVar7 - (long)puVar6 >> 2;
    if (uVar14 != (fx->d).bd) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/clab[P]lstm-parser-with-morphology/cnn/cnn/nodes.cc"
                    ,0x616,
                    "virtual void cnn::PickElement::forward_impl(const vector<const Tensor *> &, Tensor &) const"
                   );
    }
    if (puVar7 != puVar6) {
      pTVar8 = *(xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pfVar9 = pTVar8->v;
      uVar1 = (pTVar8->d).bd;
      uVar2 = (pTVar8->d).d[0];
      uVar3 = (pTVar8->d).nd;
      pfVar10 = fx->v;
      uVar13 = 0;
      do {
        iVar16 = 1;
        if ((ulong)uVar3 != 0) {
          uVar11 = 0;
          do {
            iVar16 = iVar16 * (pTVar8->d).d[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar3 != uVar11);
        }
        uVar11 = (ulong)(pTVar8->d).d[1];
        if (uVar3 < 2) {
          uVar11 = 1;
        }
        uVar11 = uVar11 * uVar2;
        uVar15 = (ulong)puVar6[uVar13];
        if (uVar11 < uVar15 || uVar11 - uVar15 == 0) goto LAB_001a6743;
        pfVar10[uVar13] = pfVar9[(uint)((int)(uVar13 % (ulong)uVar1) * iVar16) + uVar15];
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (uVar13 < uVar14);
    }
  }
  else {
    ppTVar4 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    if (((*ppTVar4)->d).d[0] <= *this->pval) {
      poVar12 = std::operator<<((ostream *)&std::cerr,"PickElement::forward_impl requested element "
                               );
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,*this->pval);
      poVar12 = std::operator<<(poVar12,"from a vector of length ");
      poVar12 = (ostream *)
                std::ostream::operator<<
                          (poVar12,((*(xs->
                                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start)->d).d[0]);
      std::endl<char,std::char_traits<char>>(poVar12);
      abort();
    }
    Tensor::operator*(&local_48,*ppTVar4);
    uVar14 = (ulong)*this->pval;
    if (local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value - uVar14 == 0 ||
        local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_cols.m_value *
        local_48.
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
        .
        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
        .m_rows.m_value < (long)uVar14) {
LAB_001a6743:
      __assert_fail("index >= 0 && index < size()",
                    "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                   );
    }
    *fx->v = local_48.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[uVar14];
  }
  return;
}

Assistant:

void PickElement::forward_impl(const vector<const Tensor*>& xs, Tensor& fx) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("PickElement not yet implemented for CUDA");
#else
  if(pval) {
    if (*pval >= xs[0]->d.rows()) {
      cerr << "PickElement::forward_impl requested element " << *pval
           << "from a vector of length " << xs[0]->d.rows() << endl;
      abort();
    }
    auto x = **xs[0];
    fx.v[0] = x(*pval);
  } else {
    assert(pvals);
    assert(pvals->size() == fx.d.batch_elems());
    for(unsigned b = 0; b < pvals->size(); ++b) {
      auto x = xs[0]->batch_matrix(b);
      fx.v[b] = x((*pvals)[b]);
    }
  }
#endif
}